

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Int64(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
        *this,int64_t i)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar1;
  uint16_t uVar2;
  
  pGVar1 = internal::Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                     (&this->stack_,1);
  (pGVar1->data_).s.str = (Ch *)0x96000000000000;
  (pGVar1->data_).n = (Number)i;
  if (i < 0) {
    uVar2 = 0xb6;
    if ((ulong)i < 0xffffffff80000000) {
      return true;
    }
  }
  else {
    uVar2 = 0x1f6;
    if ((i & 0xffffffff80000000U) != 0) {
      uVar2 = (ushort)((ulong)i >> 0x20 == 0) << 6 | 0x196;
    }
  }
  (pGVar1->data_).f.flags = uVar2;
  return true;
}

Assistant:

bool Int64(int64_t i) { new (stack_.template Push<ValueType>()) ValueType(i); return true; }